

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_set_broadcast(uv_udp_t *handle,int on)

{
  int iVar1;
  int *piVar2;
  long in_RDI;
  undefined1 local_14 [16];
  int local_4;
  
  iVar1 = setsockopt(*(int *)(in_RDI + 0x80),1,6,local_14,4);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    piVar2 = __errno_location();
    local_4 = -*piVar2;
  }
  return local_4;
}

Assistant:

int uv_udp_set_broadcast(uv_udp_t* handle, int on) {
  if (setsockopt(handle->io_watcher.fd,
                 SOL_SOCKET,
                 SO_BROADCAST,
                 &on,
                 sizeof(on))) {
    return -errno;
  }

  return 0;
}